

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_1::PosixEnv::SleepForMicroseconds(PosixEnv *this,int micros)

{
  long in_FS_OFFSET;
  duration<long,_std::ratio<1L,_1000000L>_> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.__r = (rep)micros;
  std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>(&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SleepForMicroseconds(int micros) override {
    std::this_thread::sleep_for(std::chrono::microseconds(micros));
  }